

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int emptybuffer(luaL_Buffer *B)

{
  long *plVar1;
  long *plVar2;
  long *in_RDI;
  size_t l;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  plVar1 = (long *)*in_RDI;
  plVar2 = in_RDI + 3;
  if (plVar1 != plVar2) {
    lua_pushlstring((lua_State *)l,
                    (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                    (size_t)in_RDI);
    *in_RDI = (long)(in_RDI + 3);
    *(int *)(in_RDI + 1) = (int)in_RDI[1] + 1;
  }
  return (uint)(plVar1 != plVar2);
}

Assistant:

static int emptybuffer(luaL_Buffer*B){
size_t l=bufflen(B);
if(l==0)return 0;
else{
lua_pushlstring(B->L,B->buffer,l);
B->p=B->buffer;
B->lvl++;
return 1;
}
}